

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O0

void __thiscall
BssSection_RoundTripForPopulated_Test::TestBody(BssSection_RoundTripForPopulated_Test *this)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  Message *pMVar2;
  error_code *this_01;
  char *pcVar3;
  reference this_02;
  pointer this_03;
  section_kind *lhs;
  small_vector<unsigned_char,_128UL> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
  *matcher;
  pointer *args_2;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *in_stack_fffffffffffff888;
  string local_6a0;
  AssertHelper local_680;
  Message local_678;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_638;
  Message local_630;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__1;
  Message local_608;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
  local_600;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>_>
  local_558;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_4;
  Message local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_3;
  Message local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_2;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_1;
  Message local_438;
  uint local_42c;
  size_type local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar;
  string local_408;
  AssertHelper local_3e8;
  char local_3dd;
  coord local_3dc;
  char local_3d1;
  string local_3d0;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> parser;
  section_content imported_content;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  string_mapping imported_names;
  string exported_json;
  undefined1 local_138 [8];
  section_content exported_content;
  undefined1 local_50 [8];
  string_mapping exported_names;
  section_kind kind;
  BssSection_RoundTripForPopulated_Test *this_local;
  
  exported_names.strings_._M_h._M_single_bucket._7_1_ = 2;
  pstore::exchange::export_ns::name_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)local_50,&(this->super_BssSection).export_db_);
  pstore::repo::section_content::section_content((section_content *)local_138,bss);
  local_138[1] = ' ';
  pstore::small_vector<unsigned_char,_128UL>::resize
            ((small_vector<unsigned_char,_128UL> *)&exported_content,7);
  export_section<(pstore::repo::section_kind)2>
            ((string *)&imported_names.lookup_._M_h._M_single_bucket,
             &(this->super_BssSection).export_db_,(string_mapping *)local_50,
             (section_content *)local_138,false);
  pstore::exchange::import_ns::string_mapping::string_mapping
            ((string_mapping *)
             &dispatchers.
              super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            *)&inserter);
  imported_content.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                back_inserter<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>
                          ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                            *)&inserter);
  pstore::repo::section_content::section_content((section_content *)&parser.coordinate_);
  args_2 = &imported_content.xfixups.
            super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (anonymous_namespace)::
  make_json_object_parser<pstore::exchange::import_ns::bss_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping*,pstore::repo::section_content*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (_anonymous_namespace_ *)&(this->super_BssSection).import_db_,(database *)0x2,
             (char)&dispatchers + debug_string,(string_mapping *)&parser.coordinate_,
             (section_content *)args_2,in_stack_fffffffffffff888);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
                       (string *)&imported_names.lookup_._M_h._M_single_bucket);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_3a1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_3a1 = !local_3a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pMVar2 = testing::Message::operator<<(&local_3b0,(char (*) [17])"JSON error was: ");
    this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_3d0,this_01);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_3d0);
    local_3d1 = ' ';
    pMVar2 = testing::Message::operator<<(pMVar2,&local_3d1);
    local_3dc = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_3dc);
    local_3dd = '\n';
    pMVar2 = testing::Message::operator<<(pMVar2,&local_3dd);
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imported_names.lookup_._M_h._M_single_bucket);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_408,(internal *)local_3a0,(AssertionResult *)0x2ecd1e,"true","false",
               (char *)args_2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3d0);
    testing::Message::~Message(&local_3b0);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_428 = std::
                vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                ::size((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                        *)&inserter);
    local_42c = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_420,"dispatchers.size ()","1U",&local_428,&local_42c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      pMVar2 = testing::Message::operator<<
                         (&local_438,
                          (char (*) [79])
                          "Expected a single creation dispatcher to be added to the dispatchers container"
                         );
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                 ,0x95,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_438);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      this_02 = std::
                vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                ::front((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         *)&inserter);
      this_03 = std::
                unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
                ::operator->(this_02);
      lhs = pstore::repo::section_creation_dispatcher::kind(this_03);
      testing::internal::EqHelper::
      Compare<pstore::repo::section_kind,_pstore::repo::section_kind,_nullptr>
                ((EqHelper *)local_450,"dispatchers.front ()->kind ()","kind",lhs,
                 (section_kind *)((long)&exported_names.strings_._M_h._M_single_bucket + 7));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
      if (!bVar1) {
        testing::Message::Message(&local_458);
        pMVar2 = testing::Message::operator<<
                           (&local_458,
                            (char (*) [64])
                            "The creation dispatcher should be able to create a text section");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x97,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_458);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      testing::internal::EqHelper::
      Compare<pstore::repo::section_kind,_pstore::repo::section_kind,_nullptr>
                ((EqHelper *)local_470,"imported_content.kind","exported_content.kind",
                 (section_kind *)&parser.coordinate_,local_138);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
      if (!bVar1) {
        testing::Message::Message(&local_478);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9a,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_478);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_478);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
      testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                ((EqHelper *)local_490,"imported_content.align","exported_content.align",
                 (uchar *)((long)&parser.coordinate_.column + 1),local_138 + 1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
      if (!bVar1) {
        testing::Message::Message(&local_498);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9b,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_498);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_498);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
      testing::ContainerEq<pstore::small_vector<unsigned_char,128ul>>
                (&local_600,(testing *)&exported_content,rhs);
      testing::internal::
      MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
                (&local_558,(internal *)&local_600,matcher);
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,128ul>>>>
      ::operator()(local_4b0,(char *)&local_558,
                   (small_vector<unsigned_char,_128UL> *)"imported_content.data");
      testing::internal::
      PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>_>
      ::~PredicateFormatterFromMatcher(&local_558);
      testing::
      PolymorphicMatcher<testing::internal::ContainerEqMatcher<pstore::small_vector<unsigned_char,_128UL>_>_>
      ::~PolymorphicMatcher(&local_600);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
      if (!bVar1) {
        testing::Message::Message(&local_608);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_608)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_608);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
      local_621 = std::
                  vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                  ::empty((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                           *)&imported_content.data.buffer_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_620,&local_621,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
      if (!bVar1) {
        testing::Message::Message(&local_630);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_620,
                   (AssertionResult *)"imported_content.ifixups.empty ()","false","true",
                   (char *)args_2);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_638,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_638,&local_630);
        testing::internal::AssertHelper::~AssertHelper(&local_638);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_630);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
      local_669 = std::
                  vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                  ::empty((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                           *)&imported_content.ifixups.
                              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_668,&local_669,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
      if (!bVar1) {
        testing::Message::Message(&local_678);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_6a0,(internal *)local_668,
                   (AssertionResult *)"imported_content.xfixups.empty ()","false","true",
                   (char *)args_2);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
                   ,0x9e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_680,&local_678);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        std::__cxx11::string::~string((string *)&local_6a0);
        testing::Message::~Message(&local_678);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  pstore::repo::section_content::~section_content((section_content *)&parser.coordinate_);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&inserter);
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)
             &dispatchers.
              super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&imported_names.lookup_._M_h._M_single_bucket);
  pstore::repo::section_content::~section_content((section_content *)local_138);
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_50);
  return;
}

Assistant:

TEST_F (BssSection, RoundTripForPopulated) {
    constexpr auto kind = pstore::repo::section_kind::bss;
    // The type used to store a text section's properties.
    using section_type = pstore::repo::enum_to_section_t<kind>;
    static_assert (std::is_same<section_type, pstore::repo::bss_section>::value,
                   "Expected bss to map to bss_section");

    pstore::exchange::export_ns::string_mapping exported_names{
        export_db_, pstore::exchange::export_ns::name_index_tag ()};

    pstore::repo::section_content exported_content{kind};
    exported_content.align = 32U;
    exported_content.data.resize (7);

    std::string const exported_json =
        export_section<kind> (export_db_, exported_names, exported_content, false);



    // Parse the exported names JSON. The resulting index-to-string mappings are then available via
    // imported_names.
    pstore::exchange::import_ns::string_mapping imported_names;

    // Now set up the import. We'll build two objects: an instance of a section-creation-dispatcher
    // which knows how to build a BSS section and a section-content which will describe the
    // contents of that new section.
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);

    pstore::repo::section_content imported_content;

    // Find the rule that is used to import sections represented by an instance of section_type.
    using section_importer =
        pstore::exchange::import_ns::section_to_importer_t<section_type, decltype (inserter)>;
    auto parser = make_json_object_parser<section_importer> (&import_db_, kind, &imported_names,
                                                             &imported_content, &inserter);
    parser.input (exported_json).eof ();
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ()
                                       << ' ' << parser.coordinate () << '\n'
                                       << exported_json;

    ASSERT_EQ (dispatchers.size (), 1U)
        << "Expected a single creation dispatcher to be added to the dispatchers container";
    EXPECT_EQ (dispatchers.front ()->kind (), kind)
        << "The creation dispatcher should be able to create a text section";

    EXPECT_EQ (imported_content.kind, exported_content.kind);
    EXPECT_EQ (imported_content.align, exported_content.align);
    EXPECT_THAT (imported_content.data, testing::ContainerEq (exported_content.data));
    EXPECT_TRUE (imported_content.ifixups.empty ());
    EXPECT_TRUE (imported_content.xfixups.empty ());
}